

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void t_warn(rm *loc)

{
  char *local_18;
  char *wname;
  rm *loc_local;
  
  if (loc->typ == '\b') {
    local_18 = "tuwall";
  }
  else if (loc->typ == '\n') {
    local_18 = "tlwall";
  }
  else if (loc->typ == '\v') {
    local_18 = "trwall";
  }
  else if (loc->typ == '\t') {
    local_18 = "tdwall";
  }
  else {
    local_18 = "unknown";
  }
  impossible("wall_angle: %s: case %d: seenv = 0x%x",local_18,
             (ulong)(*(uint *)&loc->field_0x6 >> 4 & 7),(ulong)loc->seenv);
  return;
}

Assistant:

static void t_warn(struct rm *loc)
{
    static const char warn_str[] = "wall_angle: %s: case %d: seenv = 0x%x";
    const char *wname;

    if (loc->typ == TUWALL) wname = "tuwall";
    else if (loc->typ == TLWALL) wname = "tlwall";
    else if (loc->typ == TRWALL) wname = "trwall";
    else if (loc->typ == TDWALL) wname = "tdwall";
    else wname = "unknown";
    impossible(warn_str, wname, loc->wall_info & WM_MASK,
	(unsigned int) loc->seenv);
}